

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int cvRcheck2(CVodeMem cv_mem)

{
  double dVar1;
  int *piVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  double t;
  
  if (cv_mem->cv_irfnd != 0) {
    CVodeGetDky(cv_mem,cv_mem->cv_tlo,0,cv_mem->cv_y);
    iVar5 = (*cv_mem->cv_gfun)(cv_mem->cv_tlo,cv_mem->cv_y,cv_mem->cv_glo,cv_mem->cv_user_data);
    cv_mem->cv_nge = cv_mem->cv_nge + 1;
    if (iVar5 != 0) {
      return -0xc;
    }
    if (0 < cv_mem->cv_nrtfn) {
      piVar2 = cv_mem->cv_iroots;
      lVar6 = 0;
      do {
        piVar2[lVar6] = 0;
        lVar6 = lVar6 + 1;
      } while (lVar6 < cv_mem->cv_nrtfn);
    }
    if (0 < cv_mem->cv_nrtfn) {
      piVar2 = cv_mem->cv_gactive;
      lVar6 = 0;
      bVar3 = false;
      do {
        if (((piVar2[lVar6] != 0) && (cv_mem->cv_glo[lVar6] == 0.0)) &&
           (!NAN(cv_mem->cv_glo[lVar6]))) {
          cv_mem->cv_iroots[lVar6] = 1;
          bVar3 = true;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < cv_mem->cv_nrtfn);
      if (bVar3) {
        dVar1 = cv_mem->cv_h;
        dVar7 = (ABS(dVar1) + ABS(cv_mem->cv_tn)) * cv_mem->cv_uround * 100.0;
        cv_mem->cv_ttol = dVar7;
        dVar7 = (double)(~-(ulong)(0.0 < dVar1) & (ulong)-dVar7 |
                        (ulong)dVar7 & -(ulong)(0.0 < dVar1));
        t = cv_mem->cv_tlo + dVar7;
        if (0.0 <= (t - cv_mem->cv_tn) * dVar1) {
          N_VLinearSum(0x3ff0000000000000,dVar7 / dVar1,cv_mem->cv_y,cv_mem->cv_zn[1],cv_mem->cv_y);
        }
        else {
          CVodeGetDky(cv_mem,t,0,cv_mem->cv_y);
        }
        iVar5 = (*cv_mem->cv_gfun)(t,cv_mem->cv_y,cv_mem->cv_ghi,cv_mem->cv_user_data);
        cv_mem->cv_nge = cv_mem->cv_nge + 1;
        if (iVar5 != 0) {
          return -0xc;
        }
        if (cv_mem->cv_nrtfn < 1) {
          return 0;
        }
        piVar2 = cv_mem->cv_gactive;
        lVar6 = 0;
        bVar4 = 0;
        do {
          if (piVar2[lVar6] != 0) {
            dVar1 = cv_mem->cv_ghi[lVar6];
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              if (cv_mem->cv_iroots[lVar6] == 1) {
                cv_mem->cv_glo[lVar6] = dVar1;
              }
            }
            else {
              if (cv_mem->cv_iroots[lVar6] == 1) {
                return 3;
              }
              cv_mem->cv_iroots[lVar6] = 1;
              bVar4 = 1;
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < cv_mem->cv_nrtfn);
        return (uint)bVar4;
      }
    }
  }
  return 0;
}

Assistant:

static int cvRcheck2(CVodeMem cv_mem)
{
  int i, retval;
  sunrealtype smallh, hratio, tplus;
  sunbooleantype zroot;

  if (cv_mem->cv_irfnd == 0) { return (CV_SUCCESS); }

  (void)CVodeGetDky(cv_mem, cv_mem->cv_tlo, 0, cv_mem->cv_y);
  retval = cv_mem->cv_gfun(cv_mem->cv_tlo, cv_mem->cv_y, cv_mem->cv_glo,
                           cv_mem->cv_user_data);
  cv_mem->cv_nge++;
  if (retval != 0) { return (CV_RTFUNC_FAIL); }

  zroot = SUNFALSE;
  for (i = 0; i < cv_mem->cv_nrtfn; i++) { cv_mem->cv_iroots[i] = 0; }
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    if (!cv_mem->cv_gactive[i]) { continue; }
    if (SUNRabs(cv_mem->cv_glo[i]) == ZERO)
    {
      zroot                = SUNTRUE;
      cv_mem->cv_iroots[i] = 1;
    }
  }
  if (!zroot) { return (CV_SUCCESS); }

  /* One or more g_i has a zero at tlo.  Check g at tlo+smallh. */
  cv_mem->cv_ttol = (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h)) *
                    cv_mem->cv_uround * HUNDRED;
  smallh = (cv_mem->cv_h > ZERO) ? cv_mem->cv_ttol : -cv_mem->cv_ttol;
  tplus  = cv_mem->cv_tlo + smallh;
  if ((tplus - cv_mem->cv_tn) * cv_mem->cv_h >= ZERO)
  {
    hratio = smallh / cv_mem->cv_h;
    N_VLinearSum(ONE, cv_mem->cv_y, hratio, cv_mem->cv_zn[1], cv_mem->cv_y);
  }
  else { (void)CVodeGetDky(cv_mem, tplus, 0, cv_mem->cv_y); }
  retval = cv_mem->cv_gfun(tplus, cv_mem->cv_y, cv_mem->cv_ghi,
                           cv_mem->cv_user_data);
  cv_mem->cv_nge++;
  if (retval != 0) { return (CV_RTFUNC_FAIL); }

  /* Check for close roots (error return), for a new zero at tlo+smallh,
  and for a g_i that changed from zero to nonzero. */
  zroot = SUNFALSE;
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    if (!cv_mem->cv_gactive[i]) { continue; }
    if (SUNRabs(cv_mem->cv_ghi[i]) == ZERO)
    {
      if (cv_mem->cv_iroots[i] == 1) { return (CLOSERT); }
      zroot                = SUNTRUE;
      cv_mem->cv_iroots[i] = 1;
    }
    else
    {
      if (cv_mem->cv_iroots[i] == 1) { cv_mem->cv_glo[i] = cv_mem->cv_ghi[i]; }
    }
  }
  if (zroot) { return (RTFOUND); }
  return (CV_SUCCESS);
}